

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

uint32_t __thiscall Cache::getReplacementBlockId(Cache *this,uint32_t set_id)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint32_t *puVar7;
  uint32_t return_id;
  uint32_t uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  uVar9 = (this->policy).associativity;
  uVar8 = uVar9 * set_id;
  uVar2 = uVar8 + uVar9;
  if (uVar8 < uVar2) {
    iVar5 = 0;
    pBVar3 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start + uVar8;
    do {
      if (pBVar3->valid != true) {
        return uVar8 - iVar5;
      }
      iVar5 = iVar5 + -1;
      pBVar3 = pBVar3 + 1;
    } while (-uVar9 != iVar5);
  }
  if (this->replace_policy == LRU) {
    if (uVar8 < uVar2) {
      uVar4 = (ulong)uVar8;
      puVar7 = &(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4].last_reference;
      uVar9 = *puVar7;
      do {
        uVar1 = *puVar7;
        bVar12 = uVar1 < uVar9;
        if (bVar12) {
          uVar9 = uVar1;
        }
        if (bVar12) {
          uVar8 = (uint32_t)uVar4;
        }
        uVar4 = uVar4 + 1;
        puVar7 = puVar7 + 0xc;
      } while (uVar2 != uVar4);
    }
  }
  else if (this->replace_policy == RANDOM) {
    uVar2 = rand();
    uVar8 = uVar2 % uVar9 + uVar8;
  }
  else {
    iVar5 = 0;
    if (1 < uVar9) {
      iVar6 = 1;
      uVar2 = 1;
      iVar5 = 0;
      do {
        lVar10 = (long)(int)uVar2;
        uVar2 = this->plru_bit[set_id][lVar10] + uVar2 * 2;
        iVar11 = this->plru_bit[set_id][lVar10] * iVar6;
        iVar6 = iVar6 * 2;
        iVar5 = iVar5 + iVar11;
      } while (uVar2 < uVar9);
    }
    uVar8 = uVar8 + iVar5;
  }
  return uVar8;
}

Assistant:

uint32_t Cache::getReplacementBlockId(uint32_t set_id) {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    // 空的
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return i;
    }

    if (this->replace_policy == Cache::ReplacePolicy::LRU) {
        // LRU
        uint32_t min_reference = this->blocks[begin].last_reference;
        uint32_t return_id = begin;
        for (uint32_t i = begin; i < end; i++) {
            if (this->blocks[i].last_reference < min_reference) {
                return_id = i;
                min_reference = this->blocks[i].last_reference;
            }
        }
        return return_id;
    } else if (this->replace_policy == Cache::ReplacePolicy::RANDOM) {
        // RANDOM
        return begin + rand() % (end - begin);
    } else {
        //PLRU
        int node, res = 0, base;
        for (node = 1, base = 1; node < this->policy.associativity; base *= 2) {
            res += base * plru_bit[set_id][node];
            node = node * 2 + plru_bit[set_id][node];
        }
        return res + begin;
    }
}